

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptorProto::InternalSwap
          (MethodDescriptorProto *this,MethodDescriptorProto *other)

{
  InternalMetadataWithArena *this_00;
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  string *psVar4;
  MethodOptions *pMVar5;
  void *pvVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  UnknownFieldSet *pUVar8;
  UnknownFieldSet *pUVar9;
  
  psVar4 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar4;
  psVar4 = (this->input_type_).ptr_;
  (this->input_type_).ptr_ = (other->input_type_).ptr_;
  (other->input_type_).ptr_ = psVar4;
  psVar4 = (this->output_type_).ptr_;
  (this->output_type_).ptr_ = (other->output_type_).ptr_;
  (other->output_type_).ptr_ = psVar4;
  pMVar5 = this->options_;
  this->options_ = other->options_;
  other->options_ = pMVar5;
  bVar1 = this->client_streaming_;
  this->client_streaming_ = other->client_streaming_;
  other->client_streaming_ = bVar1;
  bVar1 = this->server_streaming_;
  this->server_streaming_ = other->server_streaming_;
  other->server_streaming_ = bVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar6 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar9 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar6 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar8 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar8 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar7 = pUVar8->fields_;
    pUVar8->fields_ = pUVar9->fields_;
    pUVar9->fields_ = pvVar7;
  }
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void MethodDescriptorProto::InternalSwap(MethodDescriptorProto* other) {
  name_.Swap(&other->name_);
  input_type_.Swap(&other->input_type_);
  output_type_.Swap(&other->output_type_);
  std::swap(options_, other->options_);
  std::swap(client_streaming_, other->client_streaming_);
  std::swap(server_streaming_, other->server_streaming_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}